

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O0

void __thiscall ContainerToReaderWrapper::deleteReader(ContainerToReaderWrapper *this,int readerID)

{
  AbstractDemuxer *pAVar1;
  bool bVar2;
  pointer ppVar3;
  ReaderInfo *pRVar4;
  ReaderInfo *ri;
  key_type_conflict1 local_24;
  _Self local_20;
  iterator itr;
  int readerID_local;
  ContainerToReaderWrapper *this_local;
  
  local_24 = readerID;
  itr._M_node._4_4_ = readerID;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_ContainerToReaderWrapper::ReaderInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ContainerToReaderWrapper::ReaderInfo>_>_>
       ::find(&this->m_readerInfo,&local_24);
  ri = (ReaderInfo *)
       std::
       map<unsigned_int,_ContainerToReaderWrapper::ReaderInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ContainerToReaderWrapper::ReaderInfo>_>_>
       ::end(&this->m_readerInfo);
  bVar2 = std::operator==(&local_20,(_Self *)&ri);
  if (!bVar2) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_ContainerToReaderWrapper::ReaderInfo>_>
             ::operator->(&local_20);
    pRVar4 = &ppVar3->second;
    std::
    map<int,_DemuxerReadPolicy,_std::less<int>,_std::allocator<std::pair<const_int,_DemuxerReadPolicy>_>_>
    ::erase(&pRVar4->m_demuxerData->m_pids,&(ppVar3->second).m_pid);
    bVar2 = std::
            map<int,_DemuxerReadPolicy,_std::less<int>,_std::allocator<std::pair<const_int,_DemuxerReadPolicy>_>_>
            ::empty(&pRVar4->m_demuxerData->m_pids);
    if (bVar2) {
      pAVar1 = pRVar4->m_demuxerData->m_demuxer;
      if (pAVar1 != (AbstractDemuxer *)0x0) {
        (*pAVar1->_vptr_AbstractDemuxer[1])();
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>_>_>
      ::erase(&this->m_demuxers,&pRVar4->m_demuxerData->m_streamName);
    }
    std::
    map<unsigned_int,ContainerToReaderWrapper::ReaderInfo,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,ContainerToReaderWrapper::ReaderInfo>>>
    ::erase_abi_cxx11_((map<unsigned_int,ContainerToReaderWrapper::ReaderInfo,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,ContainerToReaderWrapper::ReaderInfo>>>
                        *)&this->m_readerInfo,(iterator)local_20._M_node);
  }
  return;
}

Assistant:

void ContainerToReaderWrapper::deleteReader(const int readerID)
{
    const auto itr = m_readerInfo.find(readerID);
    if (itr == m_readerInfo.end())
        return;
    const ReaderInfo& ri = itr->second;
    ri.m_demuxerData.m_pids.erase(ri.m_pid);
    if (ri.m_demuxerData.m_pids.empty())
    {
        delete ri.m_demuxerData.m_demuxer;
        m_demuxers.erase(ri.m_demuxerData.m_streamName);
    }
    m_readerInfo.erase(itr);
}